

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strand_service.hpp
# Opt level: O2

void __thiscall
asio::detail::strand_service::dispatch<std::function<void()>>
          (strand_service *this,implementation_type *impl,function<void_()> *handler)

{
  io_context_impl *owner;
  bool bVar1;
  uchar *puVar2;
  completion_handler<std::function<void_()>_> *this_00;
  long in_FS_OFFSET;
  on_dispatch_exit on_exit;
  context ctx;
  on_dispatch_exit local_70;
  ptr local_60;
  implementation_type local_48;
  implementation_type *local_40;
  undefined8 local_38;
  error_code local_30;
  
  puVar2 = call_stack<asio::detail::strand_service::strand_impl,_unsigned_char>::contains(*impl);
  if (puVar2 == (uchar *)0x0) {
    local_60.h = handler;
    this_00 = completion_handler<std::function<void_()>_>::ptr::allocate(handler);
    local_60.v = this_00;
    completion_handler<std::function<void_()>_>::completion_handler(this_00,handler);
    local_60.p = this_00;
    bVar1 = do_dispatch(this,impl,&this_00->super_operation);
    local_60.v = (completion_handler<std::function<void_()>_> *)0x0;
    local_60.p = (completion_handler<std::function<void_()>_> *)0x0;
    if (bVar1) {
      local_48 = *impl;
      local_38 = *(undefined8 *)(in_FS_OFFSET + -8);
      local_40 = &local_48;
      *(implementation_type **)(in_FS_OFFSET + -8) = local_40;
      owner = this->io_context_;
      local_70.impl_ = *impl;
      local_30._M_value = 0;
      local_70.io_context_ = owner;
      local_30._M_cat = (error_category *)std::_V2::system_category();
      completion_handler<std::function<void_()>_>::do_complete
                (owner,&this_00->super_operation,&local_30,0);
      on_dispatch_exit::~on_dispatch_exit(&local_70);
      *(undefined8 *)(in_FS_OFFSET + -8) = local_38;
    }
    completion_handler<std::function<void_()>_>::ptr::~ptr(&local_60);
  }
  else {
    std::function<void_()>::operator()(handler);
  }
  return;
}

Assistant:

void strand_service::dispatch(strand_service::implementation_type& impl,
    Handler& handler)
{
  // If we are already in the strand then the handler can run immediately.
  if (call_stack<strand_impl>::contains(impl))
  {
    fenced_block b(fenced_block::full);
    asio_handler_invoke_helpers::invoke(handler, handler);
    return;
  }

  // Allocate and construct an operation to wrap the handler.
  typedef completion_handler<Handler> op;
  typename op::ptr p = { asio::detail::addressof(handler),
    op::ptr::allocate(handler), 0 };
  p.p = new (p.v) op(handler);

  ASIO_HANDLER_CREATION((this->context(),
        *p.p, "strand", impl, 0, "dispatch"));

  bool dispatch_immediately = do_dispatch(impl, p.p);
  operation* o = p.p;
  p.v = p.p = 0;

  if (dispatch_immediately)
  {
    // Indicate that this strand is executing on the current thread.
    call_stack<strand_impl>::context ctx(impl);

    // Ensure the next handler, if any, is scheduled on block exit.
    on_dispatch_exit on_exit = { &io_context_, impl };
    (void)on_exit;

    completion_handler<Handler>::do_complete(
        &io_context_, o, asio::error_code(), 0);
  }
}